

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O3

uint32_t asm_callx_flags(ASMState *as,IRIns *ir)

{
  IRIns *pIVar1;
  uint uVar2;
  ulong uVar3;
  IRIns *pIVar4;
  
  uVar3 = (ulong)(ir->field_0).op1;
  uVar2 = 0;
  pIVar1 = as->ir;
  if ((uVar3 != 0x7fff) && (uVar2 = 1, *(char *)((long)pIVar1 + uVar3 * 8 + 5) == ']')) {
    pIVar4 = pIVar1 + uVar3;
    do {
      uVar2 = uVar2 + 1;
      pIVar4 = pIVar1 + (pIVar4->field_0).op1;
    } while ((pIVar4->field_1).o == ']');
  }
  if (*(char *)((long)pIVar1 + (ulong)(ir->field_0).op2 * 8 + 5) == ']') {
    uVar2 = uVar2 | *(uint *)(*(long *)(ulong)as->J[-1].bpropcache[9].mode +
                             (ulong)pIVar1[*(ushort *)
                                            ((long)pIVar1 + (ulong)(ir->field_0).op2 * 8 + 2)].
                                    field_1.op12 * 0x10) >> 0xc & 0x800;
  }
  return (uint)(ir->field_1).t.irt << 0x10 | uVar2;
}

Assistant:

static uint32_t asm_callx_flags(ASMState *as, IRIns *ir)
{
  uint32_t nargs = 0;
  if (ir->op1 != REF_NIL) {  /* Count number of arguments first. */
    IRIns *ira = IR(ir->op1);
    nargs++;
    while (ira->o == IR_CARG) { nargs++; ira = IR(ira->op1); }
  }
#if LJ_HASFFI
  if (IR(ir->op2)->o == IR_CARG) {  /* Copy calling convention info. */
    CTypeID id = (CTypeID)IR(IR(ir->op2)->op2)->i;
    CType *ct = ctype_get(ctype_ctsG(J2G(as->J)), id);
    nargs |= ((ct->info & CTF_VARARG) ? CCI_VARARG : 0);
#if LJ_TARGET_X86
    nargs |= (ctype_cconv(ct->info) << CCI_CC_SHIFT);
#endif
  }
#endif
  return (nargs | (ir->t.irt << CCI_OTSHIFT));
}